

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O3

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinB3LYP,void>::
eval_exc_vxc_inc_<double&,int&,double_const*&,double_const*&,double*&,double*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinB3LYP,void> *this,double *args,int *args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6)

{
  double scal_fact;
  uint N;
  const_host_buffer_type rho;
  const_host_buffer_type sigma;
  host_buffer_type eps;
  host_buffer_type vrho;
  host_buffer_type vsigma;
  ulong uVar1;
  double dStack_48;
  double dStack_40;
  double dStack_38;
  
  scal_fact = *args;
  N = *args_1;
  rho = *args_2;
  sigma = *args_3;
  eps = *args_4;
  vrho = *args_5;
  vsigma = *args_6;
  if (*(int *)(this + 8) != 0) {
    if (0 < (int)N) {
      uVar1 = 0;
      do {
        kernel_traits<ExchCXX::BuiltinB3LYP>::eval_exc_vxc_unpolar
                  (rho[uVar1],sigma[uVar1],&dStack_38,&dStack_40,&dStack_48);
        eps[uVar1] = dStack_38 * scal_fact + eps[uVar1];
        vrho[uVar1] = dStack_40 * scal_fact + vrho[uVar1];
        vsigma[uVar1] = dStack_48 * scal_fact + vsigma[uVar1];
        uVar1 = uVar1 + 1;
      } while (N != uVar1);
    }
    return;
  }
  host_eval_exc_vxc_inc_helper_polar<ExchCXX::BuiltinB3LYP>(scal_fact,N,rho,sigma,eps,vrho,vsigma);
  return;
}

Assistant:

void eval_exc_vxc_inc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_vxc_inc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_vxc_inc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }